

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void make_cond_val(c2m_ctx_t c2m_ctx,node_t_conflict r,MIR_label_t true_label,
                  MIR_label_t false_label,op_t *res)

{
  MIR_op_t op1;
  MIR_context_t __dest;
  node_t_conflict pnVar1;
  MIR_type_t t;
  MIR_op_t local_c8;
  op_t local_98;
  MIR_insn_t_conflict local_50;
  MIR_label_t end_label;
  type *type;
  gen_ctx_t_conflict gen_ctx;
  MIR_context_t ctx;
  op_t *res_local;
  MIR_label_t false_label_local;
  MIR_label_t true_label_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  gen_ctx = (gen_ctx_t_conflict)c2m_ctx->ctx;
  type = (type *)c2m_ctx->gen_ctx;
  end_label = *(MIR_label_t *)((long)r->attr + 0x18);
  ctx = (MIR_context_t)res;
  res_local = (op_t *)false_label;
  false_label_local = true_label;
  true_label_local = (MIR_label_t)r;
  r_local = (node_t_conflict)c2m_ctx;
  local_50 = MIR_new_label((MIR_context_t)gen_ctx);
  pnVar1 = r_local;
  __dest = ctx;
  t = get_mir_type((c2m_ctx_t)r_local,(type *)end_label);
  get_new_temp(&local_98,(c2m_ctx_t)pnVar1,t);
  memcpy(__dest,&local_98,0x40);
  emit_label_insn_opt((c2m_ctx_t)r_local,false_label_local);
  emit2((c2m_ctx_t)r_local,MIR_MOV,*(MIR_op_t *)&ctx->error_func,*(MIR_op_t *)&type[1].mode);
  pnVar1 = r_local;
  MIR_new_label_op(&local_c8,(MIR_context_t)gen_ctx,local_50);
  op1._8_8_ = local_c8._8_8_;
  op1.data = local_c8.data;
  op1.u.i = local_c8.u.i;
  op1.u.str.s = local_c8.u.str.s;
  op1.u._16_8_ = local_c8.u._16_8_;
  op1.u.mem.disp = local_c8.u.mem.disp;
  emit1((c2m_ctx_t)pnVar1,MIR_JMP,op1);
  emit_label_insn_opt((c2m_ctx_t)r_local,(MIR_insn_t_conflict)res_local);
  emit2((c2m_ctx_t)r_local,MIR_MOV,*(MIR_op_t *)&ctx->error_func,*(MIR_op_t *)&type->antialias);
  emit_label_insn_opt((c2m_ctx_t)r_local,local_50);
  return;
}

Assistant:

static void make_cond_val (c2m_ctx_t c2m_ctx, node_t r, MIR_label_t true_label,
                           MIR_label_t false_label, op_t *res) {
  MIR_context_t ctx = c2m_ctx->ctx;
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  struct type *type = ((struct expr *) r->attr)->type;
  MIR_label_t end_label = MIR_new_label (ctx);
  *res = get_new_temp (c2m_ctx, get_mir_type (c2m_ctx, type));
  emit_label_insn_opt (c2m_ctx, true_label);
  emit2 (c2m_ctx, MIR_MOV, res->mir_op, one_op.mir_op);
  emit1 (c2m_ctx, MIR_JMP, MIR_new_label_op (ctx, end_label));
  emit_label_insn_opt (c2m_ctx, false_label);
  emit2 (c2m_ctx, MIR_MOV, res->mir_op, zero_op.mir_op);
  emit_label_insn_opt (c2m_ctx, end_label);
}